

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

uint __thiscall
ON_SubDComponentList::CreateFromComponentList
          (ON_SubDComponentList *this,ON_SubD *subd,
          ON_SimpleArray<ON_SubDComponentPtr> *component_list)

{
  bool bVar1;
  uint uVar2;
  ON_SubDComponentPtr *this_00;
  ON_SubDComponentBase *pOVar3;
  ON_SubDComponentBase *c;
  uint local_78;
  uint i;
  uint marked_count;
  undefined1 local_60 [4];
  uint count;
  ON_SubDComponentMarksClearAndRestore saved_marks;
  ON_SimpleArray<ON_SubDComponentPtr> *component_list_local;
  ON_SubD *subd_local;
  ON_SubDComponentList *this_local;
  
  saved_marks._56_8_ = component_list;
  ON_SubDComponentMarksClearAndRestore::ON_SubDComponentMarksClearAndRestore
            ((ON_SubDComponentMarksClearAndRestore *)local_60,subd);
  uVar2 = ON_SimpleArray<ON_SubDComponentPtr>::UnsignedCount
                    ((ON_SimpleArray<ON_SubDComponentPtr> *)saved_marks._56_8_);
  local_78 = 0;
  for (c._4_4_ = 0; c._4_4_ < uVar2; c._4_4_ = c._4_4_ + 1) {
    this_00 = ON_SimpleArray<ON_SubDComponentPtr>::operator[]
                        ((ON_SimpleArray<ON_SubDComponentPtr> *)saved_marks._56_8_,c._4_4_);
    pOVar3 = ON_SubDComponentPtr::ComponentBase(this_00);
    if ((pOVar3 != (ON_SubDComponentBase *)0x0) &&
       (bVar1 = ON_ComponentStatus::RuntimeMark(&pOVar3->m_status), !bVar1)) {
      ON_ComponentStatus::SetRuntimeMark(&pOVar3->m_status);
      local_78 = local_78 + 1;
    }
  }
  uVar2 = Internal_Create(this,subd,true,true,true,true,local_78);
  ON_SubDComponentMarksClearAndRestore::~ON_SubDComponentMarksClearAndRestore
            ((ON_SubDComponentMarksClearAndRestore *)local_60);
  return uVar2;
}

Assistant:

unsigned ON_SubDComponentList::CreateFromComponentList(const ON_SubD& subd, const ON_SimpleArray<ON_SubDComponentPtr>& component_list)
{
  ON_SubDComponentMarksClearAndRestore saved_marks(subd);
  const unsigned count = component_list.UnsignedCount();
  unsigned marked_count = 0;
  for (unsigned i = 0; i < count; ++i)
  {
    const ON_SubDComponentBase* c = component_list[i].ComponentBase();
    if (nullptr == c)
      continue;
    if (c->m_status.RuntimeMark())
      continue;
    c->m_status.SetRuntimeMark();
    ++marked_count;
  }
  return Internal_Create(subd, true, true, true, true, marked_count);
}